

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

bool __thiscall
testing::internal::
TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::PendingOperationalDataset_&)>::
Matches(TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::PendingOperationalDataset_&)>
        *this,ArgumentTuple *args)

{
  char cVar1;
  undefined1 uVar2;
  DummyMatchResultListener dummy;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  cVar1 = (**(code **)(**(long **)(this + 0xf8) + 0x20))
                    (*(long **)(this + 0xf8),
                     (args->
                     super__Tuple_impl<0UL,_const_ot::commissioner::PendingOperationalDataset_&>).
                     super__Head_base<0UL,_const_ot::commissioner::PendingOperationalDataset_&,_false>
                     ._M_head_impl);
  if (cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = (**(code **)(**(long **)(this + 0x110) + 0x20))(*(long **)(this + 0x110),args);
  }
  return (bool)uVar2;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }